

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O0

void __thiscall
GEO::geofile::pull_points(geofile *this,vector<GEO::point,_std::allocator<GEO::point>_> *in_vector)

{
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  _Self local_28;
  iterator pm_it;
  iterator pm_end;
  vector<GEO::point,_std::allocator<GEO::point>_> *in_vector_local;
  geofile *this_local;
  
  sVar2 = std::
          map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
          size(&this->points_map);
  if (sVar2 != 0) {
    pm_it = std::
            map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>
            ::end(&this->points_map);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<int,_GEO::point,_std::less<int>,_std::allocator<std::pair<const_int,_GEO::point>_>_>::
         begin(&this->points_map);
    while (bVar1 = std::operator!=(&local_28,&pm_it), bVar1) {
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator->(&local_28);
      std::vector<GEO::point,_std::allocator<GEO::point>_>::push_back(in_vector,&ppVar3->second);
      std::_Rb_tree_iterator<std::pair<const_int,_GEO::point>_>::operator++(&local_28,0);
    }
  }
  return;
}

Assistant:

void GEO::geofile::pull_points(std::vector<GEO::point> &in_vector)
{
//std::map<int, point>            points_map;
    if (points_map.size()>0)
    {
        auto pm_end = points_map.end();
        for ( auto pm_it = points_map.begin();
             pm_it != pm_end; pm_it++)
        {
            in_vector.push_back(pm_it->second);
        }
    }
}